

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeAsyncGeneratorFunctionConstructor
               (DynamicObject *asyncGeneratorFunctionConstructor,
               DeferredTypeHandlerBase *typeHandler,DeferredInitializeMode mode)

{
  code *pcVar1;
  bool bVar2;
  JavascriptLibrary *this;
  ScriptContext *this_00;
  ScriptConfiguration *this_01;
  undefined4 *puVar3;
  Var value;
  DynamicObject **ppDVar4;
  JavascriptString *value_00;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *asyncGeneratorFunctionConstructor_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,asyncGeneratorFunctionConstructor,mode,3,0);
  this = RecyclableObject::GetLibrary(&asyncGeneratorFunctionConstructor->super_RecyclableObject);
  this_00 = GetScriptContext(this);
  this_01 = ScriptContext::GetConfig(this_00);
  bVar2 = ScriptConfiguration::IsES2018AsyncIterationEnabled(this_01);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0xb68,
                                "(library->GetScriptContext()->GetConfig()->IsES2018AsyncIterationEnabled())"
                                ,
                                "library->GetScriptContext()->GetConfig()->IsES2018AsyncIterationEnabled()"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  value = TaggedInt::ToVarUnchecked(1);
  AddMember(this,asyncGeneratorFunctionConstructor,0xd1,value,'\x02');
  ppDVar4 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)
                       &(this->super_JavascriptLibraryBase).asyncGeneratorFunctionPrototype);
  AddMember(this,asyncGeneratorFunctionConstructor,0x124,*ppDVar4,'\0');
  value_00 = CreateStringFromCppLiteral<23ul>(this,(char16 (*) [23])L"AsyncGeneratorFunction");
  AddMember(this,asyncGeneratorFunctionConstructor,0x106,value_00,'\x02');
  DynamicObject::SetHasNoEnumerableProperties(asyncGeneratorFunctionConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeAsyncGeneratorFunctionConstructor(DynamicObject* asyncGeneratorFunctionConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(asyncGeneratorFunctionConstructor, mode, 3);
        JavascriptLibrary* library = asyncGeneratorFunctionConstructor->GetLibrary();
        Assert(library->GetScriptContext()->GetConfig()->IsES2018AsyncIterationEnabled());

        library->AddMember(asyncGeneratorFunctionConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(asyncGeneratorFunctionConstructor, PropertyIds::prototype, library->asyncGeneratorFunctionPrototype, PropertyNone);
        library->AddMember(asyncGeneratorFunctionConstructor, PropertyIds::name, library->CreateStringFromCppLiteral(_u("AsyncGeneratorFunction")), PropertyConfigurable);

        asyncGeneratorFunctionConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }